

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

size_t UpdateNodes(size_t num_bytes,size_t block_start,size_t pos,uint8_t *ringbuffer,
                  size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                  int *starting_dist_cache,size_t num_matches,BackwardMatch *matches,
                  ZopfliCostModel *model,StartPosQueue *queue,ZopfliNode *nodes)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  BackwardMatch BVar4;
  ushort uVar5;
  ushort uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  anon_union_4_3_cc401a1e_for_u *paVar10;
  ulong uVar11;
  byte bVar12;
  ushort uVar13;
  float fVar14;
  ulong uVar15;
  uint8_t *puVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  uint8_t *puVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  ZopfliNode *in_stack_fffffffffffffef0;
  ulong local_108;
  
  uVar1 = pos + block_start;
  uVar7 = uVar1 + params->stream_offset;
  if (max_backward_limit <= uVar7) {
    uVar7 = max_backward_limit;
  }
  uVar8 = num_bytes - pos;
  iVar3 = params->quality;
  uVar15 = 0x96;
  if (10 < iVar3) {
    uVar15 = 0x145;
  }
  EvaluateNode(params->stream_offset + block_start,pos,max_backward_limit,
               (size_t)starting_dist_cache,(int *)model,(ZopfliCostModel *)queue,
               (StartPosQueue *)nodes,in_stack_fffffffffffffef0);
  uVar9 = 2;
  if (pos + 2 <= num_bytes) {
    uVar9 = (ulong)((-(int)queue->idx_ & 7U) << 5);
    fVar40 = (model->literal_costs_[pos] -
             model->literal_costs_[*(long *)((long)queue->q_[0].distance_cache + (uVar9 - 8))]) +
             *(float *)((long)queue->q_[0].distance_cache + uVar9 + 0x14) + model->min_cost_cmd_;
    paVar10 = &nodes[pos + 2].u;
    lVar23 = 4;
    uVar26 = 10;
    uVar11 = 2;
    do {
      uVar9 = uVar11;
      if (fVar40 < paVar10->cost) break;
      uVar9 = uVar11 + 1;
      bVar38 = uVar9 == uVar26;
      fVar14 = fVar40 + 1.0;
      if (!bVar38) {
        fVar14 = fVar40;
      }
      fVar40 = fVar14;
      lVar30 = 0;
      if (bVar38) {
        lVar30 = lVar23;
      }
      lVar23 = lVar23 << bVar38;
      uVar26 = uVar26 + lVar30;
      paVar10 = paVar10 + 4;
      lVar30 = pos + uVar11;
      uVar11 = uVar9;
    } while (lVar30 + 1U <= num_bytes);
  }
  uVar11 = uVar1;
  if (uVar7 < uVar1) {
    uVar11 = uVar7;
  }
  puVar16 = ringbuffer + (uVar1 & ringbuffer_mask);
  uVar24 = (ulong)((uint)uVar8 & 7);
  local_108 = 0;
  uVar26 = 0;
  do {
    uVar17 = queue->idx_;
    uVar37 = 8;
    if (uVar17 < 8) {
      uVar37 = uVar17;
    }
    if (uVar37 <= uVar26) {
      return local_108;
    }
    uVar37 = (ulong)(((int)uVar26 - (int)uVar17 & 7U) << 5);
    uVar17 = pos - *(long *)((long)queue->q_[0].distance_cache + (uVar37 - 8));
    fVar14 = (float)uVar17;
    fVar40 = fVar14;
    if (5 < uVar17) {
      if (uVar17 < 0x82) {
        uVar20 = 0x1f;
        uVar21 = (uint)(uVar17 - 2);
        if (uVar21 != 0) {
          for (; uVar21 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        fVar40 = (float)((int)(uVar17 - 2 >> ((char)(uVar20 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar20 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar17 < 0x842) {
        uVar20 = 0x1f;
        if ((int)fVar14 - 0x42U != 0) {
          for (; (int)fVar14 - 0x42U >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        fVar40 = (float)((uVar20 ^ 0xffe0) + 0x2a);
      }
      else {
        fVar40 = 2.94273e-44;
        if (0x1841 < uVar17) {
          fVar40 = (float)(uint)(ushort)(0x17 - (uVar17 < 0x5842));
        }
      }
    }
    uVar20 = (uint)fVar40 & 0xffff;
    fVar39 = (model->literal_costs_[pos] - *model->literal_costs_) +
             (float)kInsExtra[uVar20] +
             *(float *)((long)queue->q_[0].distance_cache + uVar37 + 0x10);
    if (uVar9 - 1 < uVar8) {
      uVar5 = SUB42(fVar40,0) * 8 & 0x38;
      uVar36 = 0;
      uVar17 = uVar9 - 1;
      while (uVar27 = uVar17 + (uVar1 & ringbuffer_mask), uVar27 <= ringbuffer_mask) {
        uVar34 = (long)kDistanceCacheOffset[uVar36] +
                 (long)*(int *)((long)queue->q_[0].distance_cache +
                               (ulong)kDistanceCacheIndex[uVar36] * 4 + uVar37);
        if ((uVar34 <= uVar11) && (uVar1 - uVar34 < uVar1)) {
          uVar18 = uVar1 - uVar34 & ringbuffer_mask;
          if ((uVar18 + uVar17 <= ringbuffer_mask) &&
             (ringbuffer[uVar27] == ringbuffer[uVar18 + uVar17])) {
            if (7 < uVar8) {
              lVar23 = 0;
              uVar27 = 0;
LAB_00122240:
              if (*(ulong *)(puVar16 + uVar27 * 8) == *(ulong *)(ringbuffer + uVar27 * 8 + uVar18))
              goto code_r0x00122252;
              uVar18 = *(ulong *)(ringbuffer + uVar27 * 8 + uVar18) ^
                       *(ulong *)(puVar16 + uVar27 * 8);
              uVar27 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = (uVar27 >> 3 & 0x1fffffff) - lVar23;
              goto LAB_00122286;
            }
            puVar25 = puVar16;
            uVar31 = 0;
LAB_0012242d:
            uVar27 = uVar31;
            if (uVar24 != 0) {
              uVar28 = uVar24 | uVar31;
              uVar29 = uVar24;
              do {
                uVar27 = uVar31;
                if (ringbuffer[uVar31 + uVar18] != *puVar25) break;
                puVar25 = puVar25 + 1;
                uVar31 = uVar31 + 1;
                uVar29 = uVar29 - 1;
                uVar27 = uVar28;
              } while (uVar29 != 0);
            }
LAB_00122286:
            if (uVar17 + 1 <= uVar27) {
              fVar2 = model->cost_dist_[uVar36];
              paVar10 = &nodes[pos + uVar17 + 1].u;
              uVar18 = uVar17;
              do {
                uVar17 = uVar18 + 1;
                iVar33 = (int)uVar18;
                if (uVar17 < 10) {
                  uVar21 = iVar33 - 1;
LAB_0012233f:
                  uVar6 = (ushort)uVar21;
                  uVar13 = uVar6 & 7 | uVar5;
                  if (0xf < uVar6 || (uVar36 != 0 || 7 < SUB42(fVar40,0))) goto LAB_00122367;
                  uVar13 = uVar6 & 7 | uVar5;
                  if (7 < uVar6) {
                    uVar13 = uVar13 + 0x40;
                  }
                }
                else {
                  if (uVar17 < 0x86) {
                    uVar21 = 0x1f;
                    uVar22 = (uint)(uVar18 - 5);
                    if (uVar22 != 0) {
                      for (; uVar22 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                      }
                    }
                    uVar21 = (int)(uVar18 - 5 >> ((char)(uVar21 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                             (uVar21 ^ 0xffffffe0) * 2 + 0x42;
                    goto LAB_0012233f;
                  }
                  uVar21 = 0x17;
                  uVar13 = uVar5 | 7;
                  if (uVar17 < 0x846) {
                    uVar21 = 0x1f;
                    if (iVar33 - 0x45U != 0) {
                      for (; iVar33 - 0x45U >> uVar21 == 0; uVar21 = uVar21 - 1) {
                      }
                    }
                    uVar21 = (uVar21 ^ 0xffe0) + 0x2c;
                    goto LAB_0012233f;
                  }
LAB_00122367:
                  iVar32 = ((uVar21 & 0xffff) >> 3) + (uVar20 >> 3) * 3;
                  uVar13 = uVar13 + ((ushort)(0x520d40 >> ((char)iVar32 * '\x02' & 0x1fU)) & 0xc0) +
                                    (short)iVar32 * 0x40 + 0x40;
                }
                fVar41 = fVar39;
                if (0x7f < uVar13) {
                  fVar41 = fVar2 + fVar39;
                }
                fVar41 = (float)kCopyExtra[uVar21 & 0xffff] + fVar41 + model->cost_cmd_[uVar13];
                if (fVar41 < paVar10->cost) {
                  ((ZopfliNode *)(paVar10 + -3))->length = iVar33 + 1U | 0x12000000;
                  paVar10[-2].next = (uint32_t)(float)uVar34;
                  paVar10[-1].next = (uint)fVar14 | (int)uVar36 * 0x8000000 + 0x8000000U;
                  paVar10->cost = fVar41;
                  if (local_108 <= uVar17) {
                    local_108 = uVar17;
                  }
                }
                uVar31 = uVar18 + 2;
                paVar10 = paVar10 + 4;
                uVar18 = uVar17;
              } while (uVar31 <= uVar27);
            }
          }
        }
        if ((0xe < uVar36) || (uVar36 = uVar36 + 1, uVar8 <= uVar17)) break;
      }
    }
    if (uVar26 < 2 && num_matches != 0) {
      sVar19 = 0;
      uVar17 = uVar9;
      do {
        BVar4 = matches[sVar19];
        uVar27 = (ulong)BVar4 & 0xffffffff;
        uVar37 = uVar27 + 0xf;
        uVar34 = (ulong)(params->dist).num_direct_distance_codes;
        uVar36 = uVar34 + 0x10;
        if (uVar36 <= uVar37) {
          uVar21 = (params->dist).distance_postfix_bits;
          bVar12 = (byte)uVar21;
          uVar37 = ~uVar34 + uVar27 + (4L << (bVar12 & 0x3f));
          uVar22 = 0x1f;
          uVar35 = (uint)uVar37;
          if (uVar35 != 0) {
            for (; uVar35 >> uVar22 == 0; uVar22 = uVar22 - 1) {
            }
          }
          uVar34 = (ulong)((uVar22 ^ 0xffffffe0) + 0x1f);
          lVar23 = uVar34 - uVar21;
          uVar37 = (~(-1 << (bVar12 & 0x1f)) & uVar35) + uVar36 +
                   ((ulong)((uVar37 >> (uVar34 & 0x3f) & 1) != 0) + lVar23 * 2 + -2 <<
                   (bVar12 & 0x3f)) | lVar23 * 0x400;
        }
        uVar34 = (ulong)BVar4 >> 0x25;
        uVar36 = uVar17;
        if (uVar15 < uVar34) {
          uVar36 = uVar34;
        }
        if (uVar7 < uVar27) {
          uVar36 = uVar34;
        }
        if (uVar34 <= uVar17) {
          uVar36 = uVar17;
        }
        uVar17 = uVar36;
        if (uVar36 <= uVar34) {
          fVar2 = model->cost_dist_[(uint)uVar37 & 0x3ff];
          uVar18 = (ulong)(BVar4.length_and_code & 0x1f);
          if (((ulong)BVar4 & 0x1f00000000) == 0) {
            uVar18 = uVar34;
          }
          uVar17 = uVar34 + 1;
          paVar10 = &nodes[pos + uVar36].u;
          lVar23 = uVar36 * 0x2000000 + 0x12000000;
          do {
            uVar34 = uVar36;
            if (uVar7 < uVar27) {
              uVar34 = uVar18;
            }
            iVar33 = (int)uVar34;
            if (uVar34 < 10) {
              uVar21 = iVar33 - 2;
            }
            else if (uVar34 < 0x86) {
              uVar21 = 0x1f;
              uVar22 = (uint)(uVar34 - 6);
              if (uVar22 != 0) {
                for (; uVar22 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                }
              }
              uVar21 = (int)(uVar34 - 6 >> ((char)(uVar21 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar21 ^ 0xffffffe0) * 2 + 0x42;
            }
            else {
              uVar21 = 0x17;
              if (uVar34 < 0x846) {
                uVar21 = 0x1f;
                if (iVar33 - 0x46U != 0) {
                  for (; iVar33 - 0x46U >> uVar21 == 0; uVar21 = uVar21 - 1) {
                  }
                }
                uVar21 = (uVar21 ^ 0xffe0) + 0x2c;
              }
            }
            iVar32 = ((uVar21 & 0xffff) >> 3) + (uVar20 >> 3) * 3;
            fVar41 = (float)kCopyExtra[uVar21 & 0xffff] +
                     (float)((uint)(uVar37 >> 10) & 0x3f) + fVar39 + fVar2 +
                     model->cost_cmd_
                     [(uVar21 & 7 | ((uint)fVar40 & 7) << 3) +
                      (0x520d40U >> ((char)iVar32 * '\x02' & 0x1fU) & 0xc0) + iVar32 * 0x40 + 0x40 &
                      0xffff];
            if (fVar41 < paVar10->cost) {
              ((ZopfliNode *)(paVar10 + -3))->length =
                   (uint)uVar36 | (int)lVar23 + iVar33 * -0x2000000;
              paVar10[-2].next = BVar4.distance;
              paVar10[-1].next = (uint32_t)fVar14;
              paVar10->cost = fVar41;
              if (local_108 <= uVar36) {
                local_108 = uVar36;
              }
            }
            uVar36 = uVar36 + 1;
            paVar10 = paVar10 + 4;
            lVar23 = lVar23 + 0x2000000;
          } while (uVar17 != uVar36);
        }
        sVar19 = sVar19 + 1;
      } while (sVar19 != num_matches);
    }
    if (iVar3 < 0xb) {
      return local_108;
    }
    bVar38 = 3 < uVar26;
    uVar26 = uVar26 + 1;
    if (bVar38) {
      return local_108;
    }
  } while( true );
code_r0x00122252:
  uVar27 = uVar27 + 1;
  lVar23 = lVar23 + -8;
  puVar25 = puVar16 + (uVar8 & 0xfffffffffffffff8);
  uVar31 = uVar8 & 0xfffffffffffffff8;
  if (uVar8 >> 3 == uVar27) goto LAB_0012242d;
  goto LAB_00122240;
}

Assistant:

static size_t UpdateNodes(
    const size_t num_bytes, const size_t block_start, const size_t pos,
    const uint8_t* ringbuffer, const size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t max_backward_limit,
    const int* starting_dist_cache, const size_t num_matches,
    const BackwardMatch* matches, const ZopfliCostModel* model,
    StartPosQueue* queue, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t cur_ix = block_start + pos;
  const size_t cur_ix_masked = cur_ix & ringbuffer_mask;
  const size_t max_distance = BROTLI_MIN(size_t, cur_ix, max_backward_limit);
  const size_t dictionary_start = BROTLI_MIN(size_t,
      cur_ix + stream_offset, max_backward_limit);
  const size_t max_len = num_bytes - pos;
  const size_t max_zopfli_len = MaxZopfliLen(params);
  const size_t max_iters = MaxZopfliCandidates(params);
  size_t min_len;
  size_t result = 0;
  size_t k;
  size_t gap = 0;

  EvaluateNode(block_start + stream_offset, pos, max_backward_limit, gap,
      starting_dist_cache, model, queue, nodes);

  {
    const PosData* posdata = StartPosQueueAt(queue, 0);
    float min_cost = (posdata->cost + ZopfliCostModelGetMinCostCmd(model) +
        ZopfliCostModelGetLiteralCosts(model, posdata->pos, pos));
    min_len = ComputeMinimumCopyLength(min_cost, nodes, num_bytes, pos);
  }

  /* Go over the command starting positions in order of increasing cost
     difference. */
  for (k = 0; k < max_iters && k < StartPosQueueSize(queue); ++k) {
    const PosData* posdata = StartPosQueueAt(queue, k);
    const size_t start = posdata->pos;
    const uint16_t inscode = GetInsertLengthCode(pos - start);
    const float start_costdiff = posdata->costdiff;
    const float base_cost = start_costdiff + (float)GetInsertExtra(inscode) +
        ZopfliCostModelGetLiteralCosts(model, 0, pos);

    /* Look for last distance matches using the distance cache from this
       starting position. */
    size_t best_len = min_len - 1;
    size_t j = 0;
    for (; j < BROTLI_NUM_DISTANCE_SHORT_CODES && best_len < max_len; ++j) {
      const size_t idx = kDistanceCacheIndex[j];
      const size_t backward =
          (size_t)(posdata->distance_cache[idx] + kDistanceCacheOffset[j]);
      size_t prev_ix = cur_ix - backward;
      size_t len = 0;
      uint8_t continuation = ringbuffer[cur_ix_masked + best_len];
      if (cur_ix_masked + best_len > ringbuffer_mask) {
        break;
      }
      if (BROTLI_PREDICT_FALSE(backward > dictionary_start + gap)) {
        /* Word dictionary -> ignore. */
        continue;
      }
      if (backward <= max_distance) {
        /* Regular backward reference. */
        if (prev_ix >= cur_ix) {
          continue;
        }

        prev_ix &= ringbuffer_mask;
        if (prev_ix + best_len > ringbuffer_mask ||
            continuation != ringbuffer[prev_ix + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                       &ringbuffer[cur_ix_masked],
                                       max_len);
      } else {
        /* "Gray" area. It is addressable by decoder, but this encoder
           instance does not have that data -> should not touch it. */
        continue;
      }
      {
        const float dist_cost = base_cost +
            ZopfliCostModelGetDistanceCost(model, j);
        size_t l;
        for (l = best_len + 1; l <= len; ++l) {
          const uint16_t copycode = GetCopyLengthCode(l);
          const uint16_t cmdcode =
              CombineLengthCodes(inscode, copycode, j == 0);
          const float cost = (cmdcode < 128 ? base_cost : dist_cost) +
              (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + l].u.cost) {
            UpdateZopfliNode(nodes, pos, start, l, l, backward, j + 1, cost);
            result = BROTLI_MAX(size_t, result, l);
          }
          best_len = l;
        }
      }
    }

    /* At higher iterations look only for new last distance matches, since
       looking only for new command start positions with the same distances
       does not help much. */
    if (k >= 2) continue;

    {
      /* Loop through all possible copy lengths at this position. */
      size_t len = min_len;
      for (j = 0; j < num_matches; ++j) {
        BackwardMatch match = matches[j];
        size_t dist = match.distance;
        BROTLI_BOOL is_dictionary_match =
            TO_BROTLI_BOOL(dist > dictionary_start + gap);
        /* We already tried all possible last distance matches, so we can use
           normal distance code here. */
        size_t dist_code = dist + BROTLI_NUM_DISTANCE_SHORT_CODES - 1;
        uint16_t dist_symbol;
        uint32_t distextra;
        uint32_t distnumextra;
        float dist_cost;
        size_t max_match_len;
        PrefixEncodeCopyDistance(
            dist_code, params->dist.num_direct_distance_codes,
            params->dist.distance_postfix_bits, &dist_symbol, &distextra);
        distnumextra = dist_symbol >> 10;
        dist_cost = base_cost + (float)distnumextra +
            ZopfliCostModelGetDistanceCost(model, dist_symbol & 0x3FF);

        /* Try all copy lengths up until the maximum copy length corresponding
           to this distance. If the distance refers to the static dictionary, or
           the maximum length is long enough, try only one maximum length. */
        max_match_len = BackwardMatchLength(&match);
        if (len < max_match_len &&
            (is_dictionary_match || max_match_len > max_zopfli_len)) {
          len = max_match_len;
        }
        for (; len <= max_match_len; ++len) {
          const size_t len_code =
              is_dictionary_match ? BackwardMatchLengthCode(&match) : len;
          const uint16_t copycode = GetCopyLengthCode(len_code);
          const uint16_t cmdcode = CombineLengthCodes(inscode, copycode, 0);
          const float cost = dist_cost + (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + len].u.cost) {
            UpdateZopfliNode(nodes, pos, start, len, len_code, dist, 0, cost);
            result = BROTLI_MAX(size_t, result, len);
          }
        }
      }
    }
  }
  return result;
}